

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void destStoreGray8(QRasterBuffer *rasterBuffer,int x,int y,uint *buffer,int length)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  uchar *puVar4;
  QColorSpace *this;
  QColorTransformPrivate *pQVar5;
  uchar *in_RCX;
  int in_EDX;
  int in_ESI;
  QRasterBuffer *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  QColorTransformPrivate *tfd;
  int k;
  bool failed;
  uchar *data;
  QColorTransform tf;
  QColorSpace fromCS;
  QColorSpace *in_stack_ffffffffffffff88;
  QColorSpace *in_stack_ffffffffffffff90;
  int iVar6;
  NamedColorSpace in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffc0;
  QFlagsStorage<QColorTransformPrivate::TransformFlag> flags;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar4 = QRasterBuffer::scanLine(in_RDI,in_EDX);
  this = (QColorSpace *)(puVar4 + in_ESI);
  in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb4 & 0xffffff;
  iVar6 = 0;
  do {
    if (in_R8D <= iVar6) {
LAB_00b70f4a:
      if ((in_stack_ffffffffffffffb4 & 0x1000000) != 0) {
        bVar2 = QColorSpace::isValid(in_stack_ffffffffffffff88);
        if (bVar2) {
          QColorSpace::QColorSpace(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        }
        else {
          QColorSpace::QColorSpace(this,in_stack_ffffffffffffffb4);
        }
        flags.i = 0xaaaaaaaa;
        QColorSpacePrivate::get((QColorSpace *)0xb70faf);
        QColorSpacePrivate::transformationToXYZ
                  ((QColorSpacePrivate *)CONCAT44(in_stack_ffffffffffffffb4,iVar6));
        pQVar5 = QColorTransformPrivate::get((QColorTransform *)0xb70fc6);
        QFlags<QColorTransformPrivate::TransformFlag>::QFlags
                  ((QFlags<QColorTransformPrivate::TransformFlag> *)this,
                   (TransformFlag)((ulong)pQVar5 >> 0x20));
        QColorTransformPrivate::apply<unsigned_char,unsigned_int>
                  ((QColorTransformPrivate *)CONCAT44(in_ESI,in_EDX),in_RCX,
                   (uint *)CONCAT44(in_R8D,in_stack_ffffffffffffffc0),(qsizetype)this,
                   (TransformFlags)flags.i);
        QColorTransform::~QColorTransform((QColorTransform *)0xb71028);
        QColorSpace::~QColorSpace((QColorSpace *)0xb71032);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
      __stack_chk_fail();
    }
    bVar2 = qIsGray((QRgb)((ulong)in_stack_ffffffffffffff90 >> 0x20));
    if (!bVar2) {
      in_stack_ffffffffffffffb4 = CONCAT13(1,(int3)in_stack_ffffffffffffffb4);
      goto LAB_00b70f4a;
    }
    iVar3 = qRed(*(QRgb *)(in_RCX + (long)iVar6 * 4));
    *(uchar *)((long)&(this->d_ptr).d.ptr + (long)iVar6) = (uchar)iVar3;
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

static void QT_FASTCALL destStoreGray8(QRasterBuffer *rasterBuffer, int x, int y, const uint *buffer, int length)
{
    uchar *data = rasterBuffer->scanLine(y) + x;

    bool failed = false;
    for (int k = 0; k < length; ++k) {
        if (!qIsGray(buffer[k])) {
            failed = true;
            break;
        }
        data[k] = qRed(buffer[k]);
    }
    if (failed) { // Non-gray colors
        QColorSpace fromCS = rasterBuffer->colorSpace.isValid() ? rasterBuffer->colorSpace : QColorSpace::SRgb;
        QColorTransform tf = QColorSpacePrivate::get(fromCS)->transformationToXYZ();
        QColorTransformPrivate *tfd = QColorTransformPrivate::get(tf);

        tfd->apply(data, buffer, length, QColorTransformPrivate::InputPremultiplied);
    }
}